

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O0

compile_errcode __thiscall SwitchStatement::Generate(SwitchStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  Pcode pcode_1;
  string local_168;
  allocator local_141;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  Pcode pcode;
  undefined1 local_40 [4];
  SymbolName name;
  string expression_string;
  int state;
  int ret;
  SwitchStatement *this_local;
  
  expression_string.field_2._12_4_ = 0;
  expression_string.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)local_40);
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(expression_string.field_2._8_4_) {
    case 0:
      if (SVar1 != SWITCH_SYM) {
LAB_001d3c08:
        this_local._4_4_ = -1;
        goto LAB_001d3c19;
      }
      expression_string.field_2._8_4_ = 1;
      break;
    case 1:
      if (SVar1 != L_CIRCLE_BRACKET_SYM) goto LAB_001d3c08;
      expression_string.field_2._8_4_ = 2;
      break;
    case 2:
      expression_string.field_2._12_4_ =
           Expression::Generate(&this->m_expression,(string *)local_40);
      if (expression_string.field_2._12_4_ != 0) goto LAB_001d3c08;
      expression_string.field_2._8_4_ = 3;
      break;
    case 3:
      if (SVar1 != R_CIRCLE_BRACKET_SYM) goto LAB_001d3c08;
      expression_string.field_2._8_4_ = 4;
      break;
    case 4:
      if (SVar1 != L_CURLY_BRACKET_SYM) goto LAB_001d3c08;
      expression_string.field_2._8_4_ = 5;
      break;
    case 5:
      std::__cxx11::string::string
                ((string *)(pcode.m_comment.field_2._M_local_buf + 8),(string *)local_40);
      cVar2 = SwitchTable::Generate
                        (&this->m_switch_table,(string *)((long)&pcode.m_comment.field_2 + 8),
                         &this->m_bottom_label);
      expression_string.field_2._12_4_ = cVar2;
      std::__cxx11::string::~string((string *)(pcode.m_comment.field_2._M_local_buf + 8));
      if (cVar2 != 0) goto LAB_001d3c08;
      expression_string.field_2._8_4_ = 6;
      break;
    case 6:
      expression_string.field_2._12_4_ = Default::Generate(&this->m_default);
      if (expression_string.field_2._12_4_ == 0) {
        expression_string.field_2._8_4_ = 7;
      }
      else {
        if (SVar1 != R_CURLY_BRACKET_SYM) goto LAB_001d3c08;
        std::__cxx11::string::string((string *)&local_120,(string *)&this->m_bottom_label);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_140,"",&local_141);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_168,"",
                   (allocator *)(pcode_1.m_comment.field_2._M_local_buf + 0xf));
        Pcode::Pcode((Pcode *)local_100,LABEL,&local_120,&local_140,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(pcode_1.m_comment.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
        std::__cxx11::string::~string((string *)&local_120);
        PcodeGenerator::Insert(pcode_generator,(Pcode *)local_100);
        expression_string.field_2._8_4_ = 8;
        Pcode::~Pcode((Pcode *)local_100);
      }
      break;
    case 7:
      if (SVar1 != R_CURLY_BRACKET_SYM) goto LAB_001d3c08;
      expression_string.field_2._8_4_ = 8;
      std::__cxx11::string::string((string *)&local_218,(string *)&this->m_bottom_label);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_238,"",&local_239);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_260,"",&local_261);
      Pcode::Pcode((Pcode *)local_1f8,LABEL,&local_218,&local_238,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      std::__cxx11::string::~string((string *)&local_218);
      PcodeGenerator::Insert(pcode_generator,(Pcode *)local_1f8);
      Pcode::~Pcode((Pcode *)local_1f8);
      break;
    case 8:
      this_local._4_4_ = 0;
LAB_001d3c19:
      std::__cxx11::string::~string((string *)local_40);
      return this_local._4_4_;
    }
    if (((expression_string.field_2._8_4_ != 3) && (expression_string.field_2._8_4_ != 6)) &&
       (expression_string.field_2._8_4_ != 7)) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode SwitchStatement::Generate() {
    int ret = COMPILE_OK;
    int state = 0;
    string expression_string;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == SWITCH_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Generate(expression_string)) == COMPILE_OK) {
                    state = 3;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 4: {
                if (name == L_CURLY_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 5: {
                if ((ret = m_switch_table.Generate(expression_string, m_bottom_label)) == COMPILE_OK) {
                    state = 6;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 6: {
                if ((ret = m_default.Generate()) == COMPILE_OK) {
                    state = 7;
                    break;
                } else if (name == R_CURLY_BRACKET_SYM) {
                    Pcode pcode(LABEL, m_bottom_label, EMPTY_STR, EMPTY_STR);
                    pcode_generator->Insert(pcode);
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    Pcode pcode(LABEL, m_bottom_label, EMPTY_STR, EMPTY_STR);
                    pcode_generator->Insert(pcode);
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 3 && state != 6 && state != 7)
            handle_correct_queue->NextSymbol();
    }
    ERROR_SWITCH:
       return NOT_MATCH;
}